

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::rehashPowerOfTwo(Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
                   *this,size_t numBuckets)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_true>
  *ptr;
  uint8_t *puVar1;
  size_t sVar2;
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_true>
  *pDVar3;
  ulong local_38;
  size_t i;
  size_t oldMaxElementsWithBuffer;
  uint8_t *oldInfo;
  Node *oldKeyVals;
  size_t numBuckets_local;
  Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
  *this_local;
  
  ptr = this->mKeyVals;
  puVar1 = this->mInfo;
  sVar2 = calcNumElementsWithBuffer(this,this->mMask + 1);
  init_data(this,numBuckets);
  if (1 < sVar2) {
    for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
      if (puVar1[local_38] != '\0') {
        insert_move(this,ptr + local_38);
        DataNode<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_true>
        ::~DataNode(ptr + local_38);
      }
    }
    pDVar3 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,Rml::Character,Rml::FontGlyph,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>::DataNode<robin_hood::detail::Table<true,80ul,Rml::Character,Rml::FontGlyph,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>,true>*>
                       (&this->mMask);
    if (ptr != pDVar3) {
      sVar2 = calcNumBytesTotal(this,sVar2);
      NodeAllocator<robin_hood::pair<Rml::Character,_Rml::FontGlyph>,_4UL,_16384UL,_true>::addOrFree
                ((NodeAllocator<robin_hood::pair<Rml::Character,_Rml::FontGlyph>,_4UL,_16384UL,_true>
                  *)this,ptr,sVar2);
    }
  }
  return;
}

Assistant:

void rehashPowerOfTwo(size_t numBuckets) {
        ROBIN_HOOD_TRACE(this)

        Node* const oldKeyVals = mKeyVals;
        uint8_t const* const oldInfo = mInfo;

        const size_t oldMaxElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        // resize operation: move stuff
        init_data(numBuckets);
        if (oldMaxElementsWithBuffer > 1) {
            for (size_t i = 0; i < oldMaxElementsWithBuffer; ++i) {
                if (oldInfo[i] != 0) {
                    insert_move(std::move(oldKeyVals[i]));
                    // destroy the node but DON'T destroy the data.
                    oldKeyVals[i].~Node();
                }
            }

            // this check is not necessary as it's guarded by the previous if, but it helps silence
            // g++'s overeager "attempt to free a non-heap object 'map'
            // [-Werror=free-nonheap-object]" warning.
            if (oldKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
                // don't destroy old data: put it into the pool instead
                DataPool::addOrFree(oldKeyVals, calcNumBytesTotal(oldMaxElementsWithBuffer));
            }
        }
    }